

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

Result * CoreML::validateFeatureDescriptions<CoreML::Specification::ModelDescription>
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  Rep *pRVar3;
  pointer pcVar4;
  uint uVar5;
  bool bVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  uint __val;
  long lVar13;
  _Alloc_hider _Var14;
  void **ppvVar15;
  uint __len;
  long lVar16;
  bool bVar17;
  string __str_1;
  string __str;
  string local_d8;
  ModelDescription *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    if (validationPolicy->allowsEmptyInput != false) {
      if (8 < modelVersion) goto LAB_00308be9;
      local_50[0] = &local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      local_50[0]->_M_local_buf[0] = '9';
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3dbf03);
      local_70 = &local_60;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_60 = *plVar10;
        lStack_58 = plVar7[3];
      }
      else {
        local_60 = *plVar10;
        local_70 = (long *)*plVar7;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar11 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar11) {
        local_80 = *puVar11;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar11;
        local_90 = (ulong *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      __val = -modelVersion;
      if (0 < modelVersion) {
        __val = modelVersion;
      }
      __len = 1;
      if (9 < __val) {
        uVar12 = (ulong)__val;
        uVar5 = 4;
        do {
          __len = uVar5;
          uVar9 = (uint)uVar12;
          if (uVar9 < 100) {
            __len = __len - 2;
            goto LAB_00308f79;
          }
          if (uVar9 < 1000) {
            __len = __len - 1;
            goto LAB_00308f79;
          }
          if (uVar9 < 10000) goto LAB_00308f79;
          uVar12 = uVar12 / 10000;
          uVar5 = __len + 4;
        } while (99999 < uVar9);
        __len = __len + 1;
      }
LAB_00308f79:
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_b0,(char)__len - (char)(modelVersion >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)((uint)modelVersion >> 0x1f) + (long)local_b0),__len,__val);
      uVar12 = 0xf;
      if (local_90 != &local_80) {
        uVar12 = local_80;
      }
      if (uVar12 < (ulong)(local_a8 + local_88)) {
        uVar12 = 0xf;
        if (local_b0 != local_a0) {
          uVar12 = local_a0[0];
        }
        if (uVar12 < (ulong)(local_a8 + local_88)) goto LAB_00308fe8;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      }
      else {
LAB_00308fe8:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      psVar2 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_d8.field_2._M_allocated_capacity = *psVar2;
        local_d8.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar2;
        local_d8._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d8._M_string_length = puVar8[1];
      *puVar8 = psVar2;
      puVar8[1] = 0;
      *(undefined1 *)psVar2 = 0;
      Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      _Var14._M_p = (pointer)local_50[0];
      if (local_50[0] == &local_40) {
        return __return_storage_ptr__;
      }
      goto LAB_00308d75;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Models must have one or more inputs.","");
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT,&local_d8);
  }
  else {
LAB_00308be9:
    if ((validationPolicy->allowsEmptyOutput != false) ||
       (0 < (interface->output_).super_RepeatedPtrFieldBase.current_size_)) {
      pRVar3 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      lVar13 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
      bVar17 = lVar13 == 0;
      local_b8 = interface;
      if (!bVar17) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar16 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar15 + lVar16),
                     modelVersion,INPUT);
          bVar6 = Result::good(__return_storage_ptr__);
          if (!bVar6) {
            if (!bVar17) {
              return __return_storage_ptr__;
            }
            break;
          }
          pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != paVar1) {
            operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 8;
          bVar17 = lVar13 * 8 == lVar16;
        } while (!bVar17);
      }
      pRVar3 = (local_b8->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      lVar13 = (long)(local_b8->output_).super_RepeatedPtrFieldBase.current_size_;
      bVar17 = lVar13 == 0;
      if (!bVar17) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar16 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar15 + lVar16),
                     modelVersion,OUTPUT);
          bVar6 = Result::good(__return_storage_ptr__);
          if (!bVar6) {
            if (!bVar17) {
              return __return_storage_ptr__;
            }
            break;
          }
          pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != paVar1) {
            operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 8;
          bVar17 = lVar13 * 8 == lVar16;
        } while (!bVar17);
      }
      pRVar3 = (local_b8->state_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      lVar13 = (long)(local_b8->state_).super_RepeatedPtrFieldBase.current_size_;
      bVar17 = lVar13 == 0;
      if (!bVar17) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar16 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar15 + lVar16),
                     modelVersion,STATE);
          bVar6 = Result::good(__return_storage_ptr__);
          if (!bVar6) {
            if (!bVar17) {
              return __return_storage_ptr__;
            }
            break;
          }
          pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != paVar1) {
            operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 8;
          bVar17 = lVar13 * 8 == lVar16;
        } while (!bVar17);
      }
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Models must have one or more outputs.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d8);
  }
  local_40._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
  _Var14._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
LAB_00308d75:
  operator_delete(_Var14._M_p,local_40._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateFeatureDescriptions(const Description& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (interface.input_size() < 1) {
            if (!validationPolicy.allowsEmptyInput) {
                return Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT, "Models must have one or more inputs.");
            }

            if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
                return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                               "Empty input is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                               ". This model has version " + std::to_string(modelVersion));
            }
        }

        if (!validationPolicy.allowsEmptyOutput && interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, FeatureIOType::INPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, FeatureIOType::OUTPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& state : interface.state()) {
            Result r = validateFeatureDescription(state, modelVersion, FeatureIOType::STATE);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }